

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscOutboundPacketStream.cpp
# Opt level: O0

void __thiscall osc::OutboundPacketStream::EndElement(OutboundPacketStream *this,char *endPtr)

{
  uint uVar1;
  char *pcVar2;
  uint32 elementSize;
  ptrdiff_t d;
  uint32 *previousElementSizePtr;
  char *endPtr_local;
  OutboundPacketStream *this_local;
  
  if (this->elementSizePtr_ != (uint32 *)0x0) {
    if (this->elementSizePtr_ == (uint32 *)this->data_) {
      this->elementSizePtr_ = (uint32 *)0x0;
    }
    else {
      pcVar2 = this->data_;
      uVar1 = *this->elementSizePtr_;
      FromUInt32((char *)this->elementSizePtr_,((int)endPtr - (int)this->elementSizePtr_) - 4);
      this->elementSizePtr_ = (uint32 *)(pcVar2 + uVar1);
    }
    return;
  }
  __assert_fail("elementSizePtr_ != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TheTechnobear[P]OscProxy/oscpack/osc/OscOutboundPacketStream.cpp"
                ,0xca,"void osc::OutboundPacketStream::EndElement(char *)");
}

Assistant:

void OutboundPacketStream::EndElement( char *endPtr )
{
    assert( elementSizePtr_ != 0 );

    if( elementSizePtr_ == reinterpret_cast<uint32*>(data_) ){

        elementSizePtr_ = 0;

    }else{
        // while building an element, an offset to the containing element's
        // size slot is stored in the elements size slot (or a ptr to data_
        // if there is no containing element). We retrieve that here
        uint32 *previousElementSizePtr =
                reinterpret_cast<uint32*>(data_ + *elementSizePtr_);

        // then we store the element size in the slot. note that the element
        // size does not include the size slot, hence the - 4 below.

        std::ptrdiff_t d = endPtr - reinterpret_cast<char*>(elementSizePtr_);
        // assert( d >= 4 && d <= 0x7FFFFFFF ); // assume packets smaller than 2Gb

        uint32 elementSize = static_cast<uint32>(d - 4);
        FromUInt32( reinterpret_cast<char*>(elementSizePtr_), elementSize );

        // finally, we reset the element size ptr to the containing element
        elementSizePtr_ = previousElementSizePtr;
    }
}